

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O0

_Bool remove_pending_amqp_management_operation
                (void *item,void *match_context,_Bool *continue_processing)

{
  undefined1 local_21;
  _Bool result;
  _Bool *continue_processing_local;
  void *match_context_local;
  void *item_local;
  
  if (item != match_context) {
    *continue_processing = true;
  }
  else {
    async_operation_destroy(*(ASYNC_OPERATION_HANDLE *)((long)match_context + 0x30));
    *continue_processing = false;
  }
  local_21 = item == match_context;
  return local_21;
}

Assistant:

static bool remove_pending_amqp_management_operation(const void* item, const void* match_context, bool* continue_processing)
{
    bool result;

    if (item == match_context)
    {
        async_operation_destroy(((OPERATION_MESSAGE_INSTANCE*)match_context)->execute_async_operation);

        result = true;
        *continue_processing = false;
    }
    else
    {
        result = false;
        *continue_processing = true;
    }

    return result;
}